

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::Imp::Imp
          (Imp *this,HomomorphismParams *p,shared_ptr<gss::innards::Proof> *r)

{
  this->params = p;
  std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
             &r->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
  *(undefined8 *)
   ((long)&(this->reverse_target_graph_rows).
           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>.
           _M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined8 *)
   ((long)&(this->reverse_target_graph_rows).
           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  *(undefined8 *)
   ((long)&(this->patterns_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 7) = 0;
  *(undefined8 *)
   ((long)&(this->patterns_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined8 *)
   ((long)&(this->patterns_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  *(undefined8 *)
   ((long)&(this->targets_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 7) = 0;
  *(undefined8 *)
   ((long)&(this->targets_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined8 *)
   ((long)&(this->targets_degrees).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  (this->target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->forward_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forward_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->forward_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reverse_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reverse_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reverse_target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->patterns_degrees).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_adjacencies_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_adjacencies_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_adjacencies_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pattern_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_graph_rows).
  super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_vertex_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pattern_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_edge_labels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pattern_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->target_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->target_loops).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->pattern_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_vertex_proof_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->has_pattern_cliques_sizes = false;
  (this->pattern_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pattern_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->target_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->target_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->target_cliques_sizes).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pattern_cliques_best_knowns).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern_cliques_best_knowns).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->pattern_cliques_best_knowns).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->pattern_cliques_best_knowns).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->target_cliques_best_knowns).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->target_cliques_best_knowns).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->target_cliques_best_knowns).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->largest_pattern_clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->largest_pattern_clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->largest_pattern_clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->pattern_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->pattern_cliques_build_times;
  (this->pattern_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->pattern_cliques_build_times;
  (this->pattern_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->pattern_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->pattern_cliques_solve_times;
  (this->pattern_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->pattern_cliques_solve_times;
  (this->pattern_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->pattern_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->pattern_cliques_solve_find_nodes;
  (this->pattern_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->pattern_cliques_solve_find_nodes;
  (this->pattern_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->pattern_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->pattern_cliques_solve_prove_nodes;
  (this->pattern_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->pattern_cliques_solve_prove_nodes;
  (this->pattern_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->target_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->target_cliques_build_times;
  (this->target_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->target_cliques_build_times;
  (this->target_cliques_build_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->target_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->target_cliques_solve_times;
  (this->target_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->target_cliques_solve_times;
  (this->target_cliques_solve_times).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->target_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->target_cliques_solve_find_nodes;
  (this->target_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->target_cliques_solve_find_nodes;
  (this->target_cliques_solve_find_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->target_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->target_cliques_solve_prove_nodes;
  (this->target_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->target_cliques_solve_prove_nodes;
  (this->target_cliques_solve_prove_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->supplemental_graph_names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->supplemental_graph_names;
  (this->supplemental_graph_names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->supplemental_graph_names;
  (this->supplemental_graph_names).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

Imp(const HomomorphismParams & p, const std::shared_ptr<Proof> & r) :
        params(p),
        proof(r)
    {
    }